

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSupp.c
# Opt level: O3

int Sim_ComputeSuppRoundNode(Sim_Man_t *p,int iNumCi,int fUseTargets)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  long *plVar6;
  Abc_Ntk_t *pAVar7;
  void *pvVar8;
  void **ppvVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  Vec_Vec_t *pVVar14;
  ulong uVar15;
  Sim_Pat_t *pSVar16;
  void **ppvVar17;
  Vec_Ptr_t *pVVar18;
  void *pvVar19;
  int Fill;
  uint uVar20;
  long lVar21;
  long lVar22;
  ulong extraout_RDX;
  long lVar23;
  ulong uVar24;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  timespec ts;
  ulong local_68;
  timespec local_58;
  ulong local_48;
  Vec_Vec_t *local_40;
  ulong local_38;
  
  iVar12 = clock_gettime(3,&local_58);
  if (iVar12 < 0) {
    lVar21 = 1;
  }
  else {
    lVar21 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
    lVar21 = ((lVar21 >> 7) - (lVar21 >> 0x3f)) + local_58.tv_sec * -1000000;
  }
  if ((iNumCi < 0) || (pVVar18 = p->pNtk->vCis, pVVar18->nSize <= iNumCi)) {
LAB_004d41ae:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pAVar5 = (Abc_Obj_t *)pVVar18->pArray[(uint)iNumCi];
  local_38 = (ulong)(uint)iNumCi;
  pVVar14 = Abc_DfsLevelized(pAVar5,0);
  iVar12 = clock_gettime(3,&local_58);
  if (iVar12 < 0) {
    lVar22 = -1;
  }
  else {
    lVar22 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  p->timeTrav = p->timeTrav + lVar22 + lVar21;
  Sim_UtilInfoFlip(p,pAVar5);
  uVar15 = (ulong)(uint)pVVar14->nSize;
  uVar24 = extraout_RDX;
  local_40 = pVVar14;
  if (0 < pVVar14->nSize) {
    uVar27 = 0;
    do {
      if ((long)(int)uVar15 <= (long)uVar27) {
LAB_004d4170:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      pvVar19 = pVVar14->pArray[uVar27];
      if (0 < *(int *)((long)pvVar19 + 4)) {
        lVar21 = 0;
        local_48 = uVar27;
        do {
          pAVar5 = *(Abc_Obj_t **)(*(long *)((long)pvVar19 + 8) + lVar21 * 8);
          plVar6 = (long *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
          lVar22 = *plVar6;
          iVar12 = (int)plVar6[2];
          Vec_IntFillExtra((Vec_Int_t *)(lVar22 + 0xe0),iVar12 + 1,(int)uVar24);
          if (((long)iVar12 < 0) || (*(int *)(lVar22 + 0xe4) <= iVar12)) goto LAB_004d4151;
          iVar26 = *(int *)(*(long *)(lVar22 + 0xe8) + (long)iVar12 * 4);
          iVar12 = *(int *)(*plVar6 + 0xd8);
          plVar6 = (long *)pAVar5->pNtk->vObjs->pArray[(pAVar5->vFanins).pArray[1]];
          lVar22 = *plVar6;
          iVar2 = (int)plVar6[2];
          Vec_IntFillExtra((Vec_Int_t *)(lVar22 + 0xe0),iVar2 + 1,Fill);
          if (((long)iVar2 < 0) || (*(int *)(lVar22 + 0xe4) <= iVar2)) goto LAB_004d4151;
          iVar3 = *(int *)(*(long *)(lVar22 + 0xe8) + (long)iVar2 * 4);
          iVar2 = *(int *)(*plVar6 + 0xd8);
          iVar13 = clock_gettime(3,&local_58);
          if (iVar13 < 0) {
            lVar22 = 1;
          }
          else {
            lVar22 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
            lVar22 = ((lVar22 >> 7) - (lVar22 >> 0x3f)) + local_58.tv_sec * -1000000;
          }
          Sim_UtilSimulateNode(p,pAVar5,1,(uint)(iVar26 == iVar12),(uint)(iVar3 == iVar2));
          iVar12 = clock_gettime(3,&local_58);
          if (iVar12 < 0) {
            lVar23 = -1;
          }
          else {
            lVar23 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
          }
          p->timeSim = p->timeSim + lVar23 + lVar22;
          uVar15 = (ulong)local_40->nSize;
          if ((long)uVar15 <= (long)local_48) goto LAB_004d4170;
          lVar21 = lVar21 + 1;
          pvVar19 = local_40->pArray[local_48];
          uVar24 = (ulong)*(int *)((long)pvVar19 + 4);
          pVVar14 = local_40;
          uVar27 = local_48;
        } while (lVar21 < (long)uVar24);
      }
      uVar27 = uVar27 + 1;
    } while ((long)uVar27 < (long)(int)uVar15);
  }
  if (fUseTargets == 0) {
    pVVar18 = p->pNtk->vCos;
    if (0 < pVVar18->nSize) {
      uVar25 = 1 << ((byte)iNumCi & 0x1f);
      lVar21 = 0;
      local_68 = 0;
      do {
        plVar6 = (long *)pVVar18->pArray[lVar21];
        lVar22 = *plVar6;
        iVar12 = (int)plVar6[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar22 + 0xe0),iVar12 + 1,(int)uVar24);
        if (((long)iVar12 < 0) || (*(int *)(lVar22 + 0xe4) <= iVar12)) goto LAB_004d4151;
        uVar24 = extraout_RDX_02;
        if ((*(int *)(*(long *)(lVar22 + 0xe8) + (long)iVar12 * 4) == *(int *)(*plVar6 + 0xd8)) &&
           (iVar12 = Sim_UtilInfoCompare(p,*(Abc_Obj_t **)
                                            (*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                            (long)*(int *)plVar6[4] * 8)), uVar24 = extraout_RDX_03,
           iVar12 == 0)) {
          pvVar19 = p->vSuppFun->pArray[lVar21];
          uVar20 = *(uint *)((long)pvVar19 + (ulong)((uint)iNumCi >> 5) * 4);
          if ((uVar20 & uVar25) == 0) {
            uVar24 = (ulong)((int)local_68 + 1);
            *(uint *)((long)pvVar19 + (ulong)((uint)iNumCi >> 5) * 4) = uVar20 | uVar25;
            local_68 = uVar24;
          }
        }
        lVar21 = lVar21 + 1;
        pVVar18 = p->pNtk->vCos;
      } while (lVar21 < pVVar18->nSize);
      goto LAB_004d40e5;
    }
  }
  else {
    pvVar19 = p->vSuppTargs->pArray[local_38];
    if (0 < (long)*(int *)((long)pvVar19 + 4)) {
      local_48 = (ulong)((uint)iNumCi >> 5);
      bVar11 = true;
      uVar25 = 1 << ((byte)iNumCi & 0x1f);
      local_68._0_4_ = 0;
      lVar21 = (long)*(int *)((long)pvVar19 + 4);
      do {
        uVar20 = (uint)*(undefined8 *)(*(long *)((long)pvVar19 + 8) + -8 + lVar21 * 8);
        if (((int)uVar20 < 0) || (pVVar18 = p->pNtk->vCos, pVVar18->nSize <= (int)uVar20))
        goto LAB_004d41ae;
        plVar6 = (long *)pVVar18->pArray[uVar20 & 0x7fffffff];
        pAVar5 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar6 + 0x20) + 8) + (long)*(int *)plVar6[4] * 8);
        pAVar7 = pAVar5->pNtk;
        iVar12 = pAVar5->Id;
        Vec_IntFillExtra(&pAVar7->vTravIds,iVar12 + 1,(int)uVar24);
        if (((long)iVar12 < 0) || ((pAVar7->vTravIds).nSize <= iVar12)) {
LAB_004d4151:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if ((pAVar7->vTravIds).pArray[iVar12] != pAVar5->pNtk->nTravIds) {
          __assert_fail("Abc_NodeIsTravIdCurrent(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSupp.c"
                        ,0xf3,"int Sim_ComputeSuppRoundNode(Sim_Man_t *, int, int)");
        }
        iVar12 = Sim_UtilInfoCompare(p,pAVar5);
        uVar24 = extraout_RDX_00;
        if (iVar12 == 0) {
          uVar4 = *(uint *)((long)pvVar19 + 4);
          lVar22 = (ulong)uVar4 + 1;
          do {
            if ((int)lVar22 + -1 < 1) {
              __assert_fail("i >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                            ,0x318,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
            }
            lVar23 = lVar22 + -1;
            lVar1 = lVar22 * 8;
            lVar22 = lVar23;
          } while (*(long *)(*(long *)((long)pvVar19 + 8) + -0x10 + lVar1) !=
                   *(long *)(*(long *)((long)pvVar19 + 8) + (lVar21 + -1) * 8));
          for (; (int)lVar23 < (int)uVar4; lVar23 = lVar23 + 1) {
            *(undefined8 *)(*(long *)((long)pvVar19 + 8) + -8 + lVar23 * 8) =
                 *(undefined8 *)(*(long *)((long)pvVar19 + 8) + lVar23 * 8);
          }
          *(uint *)((long)pvVar19 + 4) = uVar4 - 1;
          pvVar8 = p->vSuppFun->pArray[uVar20 & 0x7fffffff];
          uVar4 = *(uint *)((long)pvVar8 + local_48 * 4);
          if ((uVar4 & uVar25) != 0) {
            __assert_fail("!Sim_SuppFunHasVar(p->vSuppFun, Output, iNumCi)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSupp.c"
                          ,0xff,"int Sim_ComputeSuppRoundNode(Sim_Man_t *, int, int)");
          }
          local_68._0_4_ = (int)local_68 + 1;
          *(uint *)((long)pvVar8 + local_48 * 4) = uVar4 | uVar25;
          Sim_UtilInfoDetectDiffs
                    ((uint *)p->vSim0->pArray[pAVar5->Id],(uint *)p->vSim1->pArray[pAVar5->Id],
                     p->nSimWords,p->vDiffs);
          uVar24 = extraout_RDX_01;
          if ((bVar11) || (p->vFifo->nSize < 0x3e9)) {
            if (0 < p->vDiffs->nSize) {
              iVar12 = *p->vDiffs->pArray;
              pSVar16 = Sim_ManPatAlloc(p);
              pSVar16->Input = iNumCi;
              pSVar16->Output = uVar20;
              pVVar18 = p->pNtk->vCis;
              iVar26 = pVVar18->nSize;
              if (0 < iVar26) {
                ppvVar17 = pVVar18->pArray;
                ppvVar9 = p->vSim0->pArray;
                uVar24 = 0;
                do {
                  if ((*(uint *)((long)ppvVar9[*(int *)((long)ppvVar17[uVar24] + 0x10)] +
                                (long)(iVar12 >> 5) * 4) & 1 << ((byte)iVar12 & 0x1f)) != 0) {
                    pSVar16->pData[uVar24 >> 5 & 0x7ffffff] =
                         pSVar16->pData[uVar24 >> 5 & 0x7ffffff] | 1 << ((byte)uVar24 & 0x1f);
                    iVar26 = pVVar18->nSize;
                  }
                  uVar24 = uVar24 + 1;
                } while ((long)uVar24 < (long)iVar26);
              }
              pVVar18 = p->vFifo;
              uVar20 = pVVar18->nSize;
              if (uVar20 == pVVar18->nCap) {
                if ((int)uVar20 < 0x10) {
                  if (pVVar18->pArray == (void **)0x0) {
                    ppvVar17 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar17 = (void **)realloc(pVVar18->pArray,0x80);
                  }
                  pVVar18->pArray = ppvVar17;
                  pVVar18->nCap = 0x10;
                }
                else {
                  if (pVVar18->pArray == (void **)0x0) {
                    ppvVar17 = (void **)malloc((ulong)uVar20 << 4);
                  }
                  else {
                    ppvVar17 = (void **)realloc(pVVar18->pArray,(ulong)uVar20 << 4);
                  }
                  pVVar18->pArray = ppvVar17;
                  pVVar18->nCap = uVar20 * 2;
                }
              }
              else {
                ppvVar17 = pVVar18->pArray;
              }
              iVar12 = pVVar18->nSize;
              uVar20 = iVar12 + 1;
              uVar24 = (ulong)uVar20;
              pVVar18->nSize = uVar20;
              ppvVar17[iVar12] = pSVar16;
              bVar11 = false;
            }
          }
          else {
            bVar11 = false;
          }
        }
        bVar10 = 1 < lVar21;
        lVar21 = lVar21 + -1;
      } while (bVar10);
      goto LAB_004d40e5;
    }
  }
  local_68._0_4_ = 0;
LAB_004d40e5:
  pVVar14 = local_40;
  iVar12 = local_40->nSize;
  if (0 < iVar12) {
    lVar21 = 0;
    do {
      pvVar19 = pVVar14->pArray[lVar21];
      if (pvVar19 != (void *)0x0) {
        if (*(void **)((long)pvVar19 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar19 + 8));
        }
        free(pvVar19);
        iVar12 = pVVar14->nSize;
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < iVar12);
  }
  if (pVVar14->pArray != (void **)0x0) {
    free(pVVar14->pArray);
  }
  free(pVVar14);
  return (int)local_68;
}

Assistant:

int Sim_ComputeSuppRoundNode( Sim_Man_t * p, int iNumCi, int  fUseTargets )
{
    int fVerbose = 0;
    Sim_Pat_t * pPat;
    Vec_Ptr_t * vTargets;
    Vec_Vec_t * vNodesByLevel;
    Abc_Obj_t * pNodeCi, * pNode;
    int i, k, v, Output, LuckyPat, fType0, fType1;
    int Counter = 0;
    int fFirst = 1;
    abctime clk;
    // collect nodes by level in the TFO of the CI 
    // this procedure does not collect the CIs and COs
    // but it increments TravId of the collected nodes and CIs/COs
clk = Abc_Clock();
    pNodeCi       = Abc_NtkCi( p->pNtk, iNumCi );
    vNodesByLevel = Abc_DfsLevelized( pNodeCi, 0 );
p->timeTrav += Abc_Clock() - clk;
    // complement the simulation info of the selected CI
    Sim_UtilInfoFlip( p, pNodeCi );
    // simulate the levelized structure of nodes
    Vec_VecForEachEntry( Abc_Obj_t *, vNodesByLevel, pNode, i, k )
    {
        fType0 = Abc_NodeIsTravIdCurrent( Abc_ObjFanin0(pNode) );
        fType1 = Abc_NodeIsTravIdCurrent( Abc_ObjFanin1(pNode) );
clk = Abc_Clock();
        Sim_UtilSimulateNode( p, pNode, 1, fType0, fType1 );
p->timeSim += Abc_Clock() - clk;
    }
    // set the simulation info of the affected COs
    if ( fUseTargets )
    {
        vTargets = (Vec_Ptr_t *)p->vSuppTargs->pArray[iNumCi];
        for ( i = vTargets->nSize - 1; i >= 0; i-- )
        {
            // get the target output
            Output = (int)(ABC_PTRUINT_T)vTargets->pArray[i];
            // get the target node
            pNode  = Abc_ObjFanin0( Abc_NtkCo(p->pNtk, Output) );
            // the output should be in the cone
            assert( Abc_NodeIsTravIdCurrent(pNode) );

            // skip if the simulation info is equal
            if ( Sim_UtilInfoCompare( p, pNode ) )
                continue;

            // otherwise, we solved a new target
            Vec_PtrRemove( vTargets, vTargets->pArray[i] );
if ( fVerbose )
    printf( "(%d,%d) ", iNumCi, Output );
            Counter++;
            // make sure this variable is not yet detected
            assert( !Sim_SuppFunHasVar(p->vSuppFun, Output, iNumCi) );
            // set this variable
            Sim_SuppFunSetVar( p->vSuppFun, Output, iNumCi );
            
            // detect the differences in the simulation info
            Sim_UtilInfoDetectDiffs( (unsigned *)p->vSim0->pArray[pNode->Id], (unsigned *)p->vSim1->pArray[pNode->Id], p->nSimWords, p->vDiffs );
            // create new patterns
            if ( !fFirst && p->vFifo->nSize > 1000 )
                continue;

            Vec_IntForEachEntry( p->vDiffs, LuckyPat, k )
            {
                // set the new pattern
                pPat = Sim_ManPatAlloc( p );
                pPat->Input  = iNumCi;
                pPat->Output = Output;
                Abc_NtkForEachCi( p->pNtk, pNodeCi, v )
                    if ( Sim_SimInfoHasVar( p->vSim0, pNodeCi, LuckyPat ) )
                        Sim_SetBit( pPat->pData, v );
                Vec_PtrPush( p->vFifo, pPat );

                fFirst = 0;
                break;
            }
        }
if ( fVerbose && Counter )
printf( "\n" );
    }
    else
    {
        Abc_NtkForEachCo( p->pNtk, pNode, Output )
        {
            if ( !Abc_NodeIsTravIdCurrent( pNode ) )
                continue;
            if ( !Sim_UtilInfoCompare( p, Abc_ObjFanin0(pNode) ) )
            {
                if ( !Sim_SuppFunHasVar(p->vSuppFun, Output, iNumCi) )
                {
                    Counter++;
                    Sim_SuppFunSetVar( p->vSuppFun, Output, iNumCi );
                }
            }
        }
    }
    Vec_VecFree( vNodesByLevel );
    return Counter;
}